

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error TT_Load_Glyph_Header(TT_Loader loader)

{
  FT_Byte *pFVar1;
  FT_Byte *limit;
  FT_Byte *p;
  TT_Loader loader_local;
  
  pFVar1 = loader->cursor;
  if (loader->limit < pFVar1 + 10) {
    loader_local._4_4_ = 0x14;
  }
  else {
    loader->n_contours = CONCAT11(*pFVar1,pFVar1[1]);
    (loader->bbox).xMin = (long)CONCAT11(pFVar1[2],pFVar1[3]);
    (loader->bbox).yMin = (long)CONCAT11(pFVar1[4],pFVar1[5]);
    (loader->bbox).xMax = (long)CONCAT11(pFVar1[6],pFVar1[7]);
    (loader->bbox).yMax = (long)CONCAT11(pFVar1[8],pFVar1[9]);
    loader->cursor = pFVar1 + 10;
    loader_local._4_4_ = 0;
  }
  return loader_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Glyph_Header( TT_Loader  loader )
  {
    FT_Byte*  p     = loader->cursor;
    FT_Byte*  limit = loader->limit;


    if ( p + 10 > limit )
      return FT_THROW( Invalid_Outline );

    loader->n_contours = FT_NEXT_SHORT( p );

    loader->bbox.xMin = FT_NEXT_SHORT( p );
    loader->bbox.yMin = FT_NEXT_SHORT( p );
    loader->bbox.xMax = FT_NEXT_SHORT( p );
    loader->bbox.yMax = FT_NEXT_SHORT( p );

    FT_TRACE5(( "  # of contours: %d\n", loader->n_contours ));
    FT_TRACE5(( "  xMin: %4d  xMax: %4d\n", loader->bbox.xMin,
                                            loader->bbox.xMax ));
    FT_TRACE5(( "  yMin: %4d  yMax: %4d\n", loader->bbox.yMin,
                                            loader->bbox.yMax ));
    loader->cursor = p;

    return FT_Err_Ok;
  }